

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseArray<TgBot::ShippingOption>
          (string *__return_storage_ptr__,TgTypeParser *this,
          TgTypeToJsonFunc<TgBot::ShippingOption> parseFunc,
          vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
          *objects)

{
  bool bVar1;
  long lVar2;
  vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
  *in_R8;
  vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
  *local_d0;
  string local_98 [32];
  reference local_78;
  shared_ptr<TgBot::ShippingOption> *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
  *__range2;
  allocator local_41;
  vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
  *local_40;
  vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
  *objects_local;
  TgTypeToJsonFunc<TgBot::ShippingOption> parseFunc_local;
  TgTypeParser *local_28;
  TgTypeParser *this_local;
  vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
  *local_18;
  string *local_10;
  string *result;
  
  local_40 = in_R8;
  objects_local =
       (vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
        *)parseFunc;
  parseFunc_local = (TgTypeToJsonFunc<TgBot::ShippingOption>)objects;
  local_28 = this;
  this_local = (TgTypeParser *)parseFunc;
  local_18 = objects;
  local_10 = __return_storage_ptr__;
  bVar1 = std::
          vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
          ::empty(in_R8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
    __end0 = std::
             vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
             ::begin(local_40);
    item = (shared_ptr<TgBot::ShippingOption> *)
           std::
           vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
           ::end(local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_std::shared_ptr<TgBot::ShippingOption>_*,_std::vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>_>
                                       *)&item), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<TgBot::ShippingOption>_*,_std::vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>_>
                 ::operator*(&__end0);
      if (((ulong)objects_local & 1) == 0) {
        local_d0 = objects_local;
      }
      else {
        local_d0 = *(vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>
                     **)(objects_local + *(long *)(this + parseFunc_local) + -1);
      }
      (*(code *)local_d0)(local_98,this + parseFunc_local,local_78);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,',');
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<TgBot::ShippingOption>_*,_std::vector<std::shared_ptr<TgBot::ShippingOption>,_std::allocator<std::shared_ptr<TgBot::ShippingOption>_>_>_>
      ::operator++(&__end0);
    }
    lVar2 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 - 1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseArray(TgTypeToJsonFunc<T> parseFunc, const std::vector<std::shared_ptr<T>>& objects) const {
        if (objects.empty())
            return "";
        std::string result;
        result += '[';
        for (const std::shared_ptr<T>& item : objects) {
            result += (this->*parseFunc)(item);
            result += ',';
        }
        result.erase(result.length() - 1);
        result += ']';
        return result;
    }